

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WildcardPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPatternSyntax,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  WildcardPatternSyntax *pWVar11;
  
  pWVar11 = (WildcardPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WildcardPatternSyntax *)this->endPtr < pWVar11 + 1) {
    pWVar11 = (WildcardPatternSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pWVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pWVar11->super_PatternSyntax).super_SyntaxNode.kind = WildcardPattern;
  (pWVar11->super_PatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pWVar11->super_PatternSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pWVar11->dot).kind = TVar3;
  (pWVar11->dot).field_0x2 = uVar4;
  (pWVar11->dot).numFlags = (NumericTokenFlags)NVar5.raw;
  (pWVar11->dot).rawLen = uVar6;
  (pWVar11->dot).info = pIVar1;
  (pWVar11->star).kind = TVar7;
  (pWVar11->star).field_0x2 = uVar8;
  (pWVar11->star).numFlags = (NumericTokenFlags)NVar9.raw;
  (pWVar11->star).rawLen = uVar10;
  (pWVar11->star).info = pIVar2;
  return pWVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }